

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

double * SoapySDRDevice_listSampleRates
                   (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  size_t *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [32];
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  double *local_8;
  
  *in_RCX = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0x208))(local_40,local_10,local_14,local_20);
  local_8 = toNumericList(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffb0);
  return local_8;
}

Assistant:

double *SoapySDRDevice_listSampleRates(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toNumericList(device->listSampleRates(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}